

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_inst.h
# Opt level: O0

void __thiscall
mocker::ir::Call::Call<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Addr>>
          (Call *this,shared_ptr<mocker::ir::Reg> *dest,string *funcName,
          shared_ptr<mocker::ir::Addr> *args,shared_ptr<mocker::ir::Addr> *args_1)

{
  initializer_list<std::shared_ptr<mocker::ir::Addr>_> __l;
  shared_ptr<mocker::ir::Addr> *local_e8;
  allocator<std::shared_ptr<mocker::ir::Addr>_> local_71;
  shared_ptr<mocker::ir::Addr> local_70;
  shared_ptr<mocker::ir::Addr> local_60;
  shared_ptr<mocker::ir::Addr> local_50;
  shared_ptr<mocker::ir::Reg> local_40;
  shared_ptr<mocker::ir::Addr> *local_30;
  shared_ptr<mocker::ir::Addr> *args_local_1;
  shared_ptr<mocker::ir::Addr> *args_local;
  string *funcName_local;
  shared_ptr<mocker::ir::Reg> *dest_local;
  Call *this_local;
  
  local_30 = args_1;
  args_local_1 = args;
  args_local = (shared_ptr<mocker::ir::Addr> *)funcName;
  funcName_local = (string *)dest;
  dest_local = (shared_ptr<mocker::ir::Reg> *)this;
  IRInst::IRInst(&this->super_IRInst,Call);
  std::shared_ptr<mocker::ir::Reg>::shared_ptr(&local_40,dest);
  Definition::Definition(&this->super_Definition,&local_40);
  std::shared_ptr<mocker::ir::Reg>::~shared_ptr(&local_40);
  (this->super_IRInst)._vptr_IRInst = (_func_int **)&PTR__Call_0039b2b0;
  (this->super_Definition)._vptr_Definition = (_func_int **)&PTR__Call_0039b2d0;
  std::__cxx11::string::string((string *)&this->funcName,(string *)funcName);
  std::shared_ptr<mocker::ir::Addr>::shared_ptr(&local_70,args);
  std::shared_ptr<mocker::ir::Addr>::shared_ptr(&local_60,args_1);
  local_50.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
  local_50.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_70;
  std::allocator<std::shared_ptr<mocker::ir::Addr>_>::allocator(&local_71);
  __l._M_len = (size_type)
               local_50.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi;
  __l._M_array = (iterator)
                 local_50.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>::
  vector(&this->args,__l,&local_71);
  std::allocator<std::shared_ptr<mocker::ir::Addr>_>::~allocator(&local_71);
  local_e8 = &local_50;
  do {
    local_e8 = local_e8 + -1;
    std::shared_ptr<mocker::ir::Addr>::~shared_ptr(local_e8);
  } while (local_e8 != &local_70);
  return;
}

Assistant:

Call(std::shared_ptr<Reg> dest, std::string funcName, Args... args)
      : IRInst(InstType::Call), Definition(std::move(dest)),
        funcName(std::move(funcName)), args({std::move(args)...}) {}